

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formats.h
# Opt level: O0

string * ktx::toString_abi_cxx11_(khr_df_model_e model)

{
  char *__s;
  v10 *in_RSI;
  string *in_RDI;
  char *str;
  undefined1 in_stack_00000128 [16];
  undefined1 in_stack_00000138 [16];
  string *__a;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  char *local_f8 [2];
  byte local_e2;
  allocator<char> local_e1;
  char *local_e0;
  undefined4 local_d4;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_c8 [3];
  undefined8 local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_a8;
  char *local_a0;
  size_t local_98;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int> *local_90
  ;
  char *local_88;
  size_t sStack_80;
  char *local_70;
  char **local_68;
  char *local_60;
  char **local_58;
  undefined8 *local_50;
  char *local_48;
  size_t sStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_38;
  undefined8 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_20;
  undefined8 local_18;
  undefined8 *local_10;
  char *local_8;
  
  local_d4 = SUB84(in_RSI,0);
  __a = in_RDI;
  __s = (char *)dfdToStringColorModel((ulong)in_RSI & 0xffffffff);
  local_e2 = 0;
  local_e0 = __s;
  if (__s == (char *)0x0) {
    local_68 = local_f8;
    local_70 = "(0x{:02X})";
    local_60 = "(0x{:02X})";
    local_f8[0] = "(0x{:02X})";
    local_58 = local_68;
    local_98 = std::char_traits<char>::length((char_type *)0x2798e5);
    local_8 = local_70;
    local_88 = local_f8[0];
    local_90 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
                *)&stack0xffffffffffffff04;
    local_50 = &local_88;
    local_a0 = local_f8[0];
    sStack_80 = local_98;
    local_48 = local_a0;
    sStack_40 = local_98;
    local_c8[0] = ::fmt::v10::
                  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                            (local_90,in_RSI,(uint *)in_RDI);
    local_30 = &local_b0;
    local_38 = local_c8;
    local_18 = 2;
    local_b0 = 2;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    local_a8 = local_38;
    ::fmt::v10::vformat_abi_cxx11_((string_view)in_stack_00000138,(format_args)in_stack_00000128);
  }
  else {
    std::allocator<char>::allocator();
    local_e2 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),__s,
               (allocator<char> *)__a);
  }
  if ((local_e2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_e1);
  }
  return __a;
}

Assistant:

[[nodiscard]] inline std::string toString(khr_df_model_e model) noexcept {
    const auto str = dfdToStringColorModel(model);
    return str ? std::string(str) : fmt::format("(0x{:02X})", static_cast<uint32_t>(model));
}